

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_dynamic_histogram<long,_(unsigned_char)'\x02'>::basic_dynamic_histogram
          (basic_dynamic_histogram<long,_(unsigned_char)__x02_> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *buckets,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  long *plVar1;
  pointer pcVar2;
  bool bVar3;
  basic_dynamic_histogram<long,_(unsigned_char)__x02_> *pbVar4;
  long lVar5;
  string *psVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 local_e9;
  basic_dynamic_histogram<long,_(unsigned_char)__x02_> *local_e8;
  string *local_e0;
  string *local_d8;
  shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> local_d0;
  string local_c0;
  string local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  undefined1 local_70 [32];
  long local_50 [4];
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_e8 = this;
  local_e0 = name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + name->_M_string_length);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar2 = (help->_M_dataplus)._M_p;
  local_d8 = help;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + help->_M_string_length);
  bVar8 = false;
  lVar5 = 0;
  psVar6 = (string *)local_70;
  do {
    *(string **)psVar6 = psVar6 + 0x10;
    pcVar2 = labels_name->_M_elems[lVar5]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              (psVar6,pcVar2,pcVar2 + labels_name->_M_elems[lVar5]._M_string_length);
    pbVar4 = local_e8;
    lVar5 = 1;
    bVar3 = !bVar8;
    bVar8 = true;
    psVar6 = (string *)local_50;
  } while (bVar3);
  metric_t::metric_t<2ul>
            ((metric_t *)local_e8,Histogram,&local_a0,&local_c0,
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)local_70);
  (pbVar4->super_dynamic_metric).super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__metric_t_001fdf50;
  lVar5 = 0;
  do {
    plVar1 = (long *)((long)local_50 + lVar5 + 0x10);
    if (plVar1 != *(long **)((long)local_50 + lVar5)) {
      operator_delete(*(long **)((long)local_50 + lVar5),*plVar1 + 1);
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  (pbVar4->super_dynamic_metric).super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__basic_dynamic_histogram_001ff2c8;
  std::vector<double,_std::allocator<double>_>::vector(&pbVar4->bucket_boundaries_,buckets);
  (pbVar4->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pbVar4->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pbVar4->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pbVar4->sum_).
  super___shared_ptr<ylt::metric::basic_dynamic_gauge<long,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_80 = &(pbVar4->sum_).
              super___shared_ptr<ylt::metric::basic_dynamic_gauge<long,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  local_78 = &pbVar4->bucket_boundaries_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ylt::metric::basic_dynamic_gauge<long,(unsigned_char)2>,std::allocator<ylt::metric::basic_dynamic_gauge<long,(unsigned_char)2>>,std::__cxx11::string&,std::__cxx11::string&,std::array<std::__cxx11::string,2ul>&>
            (local_80,(basic_dynamic_gauge<long,_(unsigned_char)__x02_> **)&pbVar4->sum_,
             (allocator<ylt::metric::basic_dynamic_gauge<long,_(unsigned_char)__x02_>_> *)&local_d0,
             local_e0,local_d8,labels_name);
  if ((long)(buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start != -8) {
    uVar7 = 0;
    do {
      local_d0.
      super___shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>,std::allocator<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>,std::__cxx11::string&,std::__cxx11::string&,std::array<std::__cxx11::string,2ul>&>
                (&local_d0.
                  super___shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(basic_dynamic_counter<long,_(unsigned_char)__x02_> **)&local_d0,
                 (allocator<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> *)
                 &local_e9,local_e0,local_d8,labels_name);
      std::
      vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>,std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>>>
      ::emplace_back<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>>
                ((vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>,std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>>>
                  *)&pbVar4->bucket_counts_,&local_d0);
      if (local_d0.
          super___shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.
                   super___shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < ((long)(buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3) + 1U);
  }
  return;
}

Assistant:

basic_dynamic_histogram(std::string name, std::string help,
                          std::vector<double> buckets,
                          std::array<std::string, N> labels_name)
      : bucket_boundaries_(buckets),
        dynamic_metric(MetricType::Histogram, name, help, labels_name),
        sum_(std::make_shared<basic_dynamic_gauge<value_type, N>>(
            name, help, labels_name)) {
    for (size_t i = 0; i < buckets.size() + 1; i++) {
      bucket_counts_.push_back(
          std::make_shared<basic_dynamic_counter<value_type, N>>(name, help,
                                                                 labels_name));
    }
  }